

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

_Bool al_get_monitor_info(int adapter,ALLEGRO_MONITOR_INFO *info)

{
  int iVar1;
  ALLEGRO_SYSTEM *pAVar2;
  ALLEGRO_MONITOR_INFO *in_RSI;
  int in_EDI;
  ALLEGRO_SYSTEM *system;
  _Bool local_1;
  
  pAVar2 = al_get_system_driver();
  iVar1 = al_get_num_video_adapters();
  if ((((in_EDI < iVar1) && (pAVar2 != (ALLEGRO_SYSTEM *)0x0)) &&
      (pAVar2->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (pAVar2->vt->get_monitor_info != (_func__Bool_int_ALLEGRO_MONITOR_INFO_ptr *)0x0)) {
    local_1 = (*pAVar2->vt->get_monitor_info)(in_EDI,in_RSI);
  }
  else {
    in_RSI->y2 = 0x7fffffff;
    in_RSI->x2 = 0x7fffffff;
    in_RSI->y1 = 0x7fffffff;
    in_RSI->x1 = 0x7fffffff;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_get_monitor_info(int adapter, ALLEGRO_MONITOR_INFO *info)
{
   ALLEGRO_SYSTEM *system = al_get_system_driver();

   if (adapter < al_get_num_video_adapters()) {
      if (system && system->vt && system->vt->get_monitor_info) {
         return system->vt->get_monitor_info(adapter, info);
      }
   }

   info->x1 = info->y1 = info->x2 = info->y2 = INT_MAX;
   return false;
}